

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O0

void __thiscall sysapi::epoll_registration::~epoll_registration(epoll_registration *this)

{
  epoll_registration *this_local;
  
  clear(this);
  std::function<void_(unsigned_int)>::~function(&this->callback);
  return;
}

Assistant:

epoll_registration::~epoll_registration()
{
    clear();
}